

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_ge_verify(secp256k1_ge *a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint64_t uVar64;
  uint64_t uVar65;
  uint64_t uVar66;
  uint64_t uVar67;
  int iVar68;
  int iVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  secp256k1_gej *a_00;
  secp256k1_fe *a_01;
  ulong uVar74;
  secp256k1_gej *in_RSI;
  secp256k1_gej *a_02;
  ulong uVar75;
  secp256k1_gej *a_03;
  secp256k1_gej *r;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  
  secp256k1_fe_verify(&a->x);
  a_03 = (secp256k1_gej *)&a->y;
  secp256k1_fe_verify((secp256k1_fe *)a_03);
  if ((uint)a->infinity < 2) {
    return;
  }
  secp256k1_ge_verify_cold_1();
  a_02 = in_RSI;
  secp256k1_fe_verify(&in_RSI->x);
  r = a_00;
  secp256k1_fe_verify(&a_00->x);
  if ((in_RSI->x).magnitude < 9) {
    if (8 < (a_00->x).magnitude) goto LAB_001187d8;
    if (a_03 != a_00) {
      if (in_RSI != a_00) {
        uVar73 = (in_RSI->x).n[0];
        uVar78 = (in_RSI->x).n[1];
        uVar74 = (in_RSI->x).n[2];
        uVar75 = (in_RSI->x).n[3];
        uVar76 = (in_RSI->x).n[4];
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (a_00->x).n[0];
        auVar31._8_8_ = 0;
        auVar31._0_8_ = uVar75;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (a_00->x).n[1];
        auVar32._8_8_ = 0;
        auVar32._0_8_ = uVar74;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (a_00->x).n[2];
        auVar33._8_8_ = 0;
        auVar33._0_8_ = uVar78;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (a_00->x).n[3];
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uVar73;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (a_00->x).n[4];
        auVar35._8_8_ = 0;
        auVar35._0_8_ = uVar76;
        uVar70 = SUB168(auVar5 * auVar35,0);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar70 & 0xfffffffffffff;
        auVar1 = auVar2 * auVar32 + auVar1 * auVar31 + auVar3 * auVar33 + auVar4 * auVar34 +
                 auVar6 * ZEXT816(0x1000003d10);
        uVar71 = auVar1._0_8_;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = uVar71 >> 0x34 | auVar1._8_8_ << 0xc;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (a_00->x).n[0];
        auVar36._8_8_ = 0;
        auVar36._0_8_ = uVar76;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (a_00->x).n[1];
        auVar37._8_8_ = 0;
        auVar37._0_8_ = uVar75;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (a_00->x).n[2];
        auVar38._8_8_ = 0;
        auVar38._0_8_ = uVar74;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = (a_00->x).n[3];
        auVar39._8_8_ = 0;
        auVar39._0_8_ = uVar78;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = (a_00->x).n[4];
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar73;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = uVar70 >> 0x34 | SUB168(auVar5 * auVar35,8) << 0xc;
        auVar1 = auVar7 * auVar36 + auVar57 + auVar8 * auVar37 + auVar9 * auVar38 +
                 auVar10 * auVar39 + auVar11 * auVar40 + auVar12 * ZEXT816(0x1000003d10);
        uVar70 = auVar1._0_8_;
        auVar58._8_8_ = 0;
        auVar58._0_8_ = uVar70 >> 0x34 | auVar1._8_8_ << 0xc;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = (a_00->x).n[0];
        auVar41._8_8_ = 0;
        auVar41._0_8_ = uVar73;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = (a_00->x).n[1];
        auVar42._8_8_ = 0;
        auVar42._0_8_ = uVar76;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = (a_00->x).n[2];
        auVar43._8_8_ = 0;
        auVar43._0_8_ = uVar75;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = (a_00->x).n[3];
        auVar44._8_8_ = 0;
        auVar44._0_8_ = uVar74;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = (a_00->x).n[4];
        auVar45._8_8_ = 0;
        auVar45._0_8_ = uVar78;
        auVar1 = auVar14 * auVar42 + auVar58 + auVar15 * auVar43 + auVar16 * auVar44 +
                 auVar17 * auVar45;
        uVar72 = auVar1._0_8_;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = uVar72 >> 0x34 | auVar1._8_8_ << 0xc;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = (uVar72 & 0xfffffffffffff) << 4 | (uVar70 & 0xfffffffffffff) >> 0x30;
        auVar1 = auVar13 * auVar41 + ZEXT816(0x1000003d1) * auVar46;
        uVar72 = auVar1._0_8_;
        (a_03->x).n[0] = uVar72 & 0xfffffffffffff;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = uVar72 >> 0x34 | auVar1._8_8_ << 0xc;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = (a_00->x).n[0];
        auVar47._8_8_ = 0;
        auVar47._0_8_ = uVar78;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = (a_00->x).n[1];
        auVar48._8_8_ = 0;
        auVar48._0_8_ = uVar73;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = (a_00->x).n[2];
        auVar49._8_8_ = 0;
        auVar49._0_8_ = uVar76;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = (a_00->x).n[3];
        auVar50._8_8_ = 0;
        auVar50._0_8_ = uVar75;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = (a_00->x).n[4];
        auVar51._8_8_ = 0;
        auVar51._0_8_ = uVar74;
        auVar2 = auVar20 * auVar49 + auVar60 + auVar21 * auVar50 + auVar22 * auVar51;
        uVar72 = auVar2._0_8_;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = uVar72 & 0xfffffffffffff;
        auVar1 = auVar18 * auVar47 + auVar59 + auVar19 * auVar48 + auVar23 * ZEXT816(0x1000003d10);
        uVar77 = auVar1._0_8_;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = uVar72 >> 0x34 | auVar2._8_8_ << 0xc;
        (a_03->x).n[1] = uVar77 & 0xfffffffffffff;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = uVar77 >> 0x34 | auVar1._8_8_ << 0xc;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = (a_00->x).n[0];
        auVar52._8_8_ = 0;
        auVar52._0_8_ = uVar74;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = (a_00->x).n[1];
        auVar53._8_8_ = 0;
        auVar53._0_8_ = uVar78;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = (a_00->x).n[2];
        auVar54._8_8_ = 0;
        auVar54._0_8_ = uVar73;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = (a_00->x).n[3];
        auVar55._8_8_ = 0;
        auVar55._0_8_ = uVar76;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = (a_00->x).n[4];
        auVar56._8_8_ = 0;
        auVar56._0_8_ = uVar75;
        auVar2 = auVar27 * auVar55 + auVar62 + auVar28 * auVar56;
        uVar73 = auVar2._0_8_;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uVar73 & 0xfffffffffffff;
        auVar1 = auVar24 * auVar52 + auVar61 + auVar25 * auVar53 + auVar26 * auVar54 +
                 auVar29 * ZEXT816(0x1000003d10);
        uVar78 = auVar1._0_8_;
        (a_03->x).n[2] = uVar78 & 0xfffffffffffff;
        auVar63._8_8_ = 0;
        auVar63._0_8_ = (uVar78 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar71 & 0xfffffffffffff);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = uVar73 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar63 = auVar30 * ZEXT816(0x1000003d10) + auVar63;
        uVar73 = auVar63._0_8_;
        (a_03->x).n[3] = uVar73 & 0xfffffffffffff;
        (a_03->x).n[4] = (uVar73 >> 0x34 | auVar63._8_8_ << 0xc) + (uVar70 & 0xffffffffffff);
        (a_03->x).magnitude = 1;
        (a_03->x).normalized = 0;
        secp256k1_fe_verify(&a_03->x);
        return;
      }
      goto LAB_001187e2;
    }
  }
  else {
    secp256k1_fe_mul_cold_4();
LAB_001187d8:
    secp256k1_fe_mul_cold_3();
  }
  secp256k1_fe_mul_cold_2();
LAB_001187e2:
  secp256k1_fe_mul_cold_1();
  secp256k1_gej_verify(a_02);
  if (a_02->infinity == 0) {
    if (a_01 != (secp256k1_fe *)0x0) {
      uVar64 = (a_02->y).n[0];
      uVar65 = (a_02->y).n[1];
      uVar66 = (a_02->y).n[2];
      uVar67 = (a_02->y).n[3];
      iVar68 = (a_02->y).magnitude;
      iVar69 = (a_02->y).normalized;
      a_01->n[4] = (a_02->y).n[4];
      a_01->magnitude = iVar68;
      a_01->normalized = iVar69;
      a_01->n[2] = uVar66;
      a_01->n[3] = uVar67;
      a_01->n[0] = uVar64;
      a_01->n[1] = uVar65;
      secp256k1_fe_verify(a_01);
      uVar73 = a_01->n[4];
      uVar74 = (uVar73 >> 0x30) * 0x1000003d1 + a_01->n[0];
      uVar78 = (uVar74 >> 0x34) + a_01->n[1];
      uVar75 = (uVar78 >> 0x34) + a_01->n[2];
      uVar76 = (uVar75 >> 0x34) + a_01->n[3];
      a_01->n[0] = uVar74 & 0xfffffffffffff;
      a_01->n[1] = uVar78 & 0xfffffffffffff;
      a_01->n[2] = uVar75 & 0xfffffffffffff;
      a_01->n[3] = uVar76 & 0xfffffffffffff;
      a_01->n[4] = (uVar76 >> 0x34) + (uVar73 & 0xffffffffffff);
      a_01->magnitude = 1;
      secp256k1_fe_verify(a_01);
    }
    secp256k1_gej_double(r,a_02);
    secp256k1_gej_verify(r);
    return;
  }
  secp256k1_gej_set_infinity(r);
  if (a_01 != (secp256k1_fe *)0x0) {
    a_01->n[0] = 1;
    a_01->n[1] = 0;
    a_01->n[2] = 0;
    a_01->n[3] = 0;
    a_01->n[4] = 0;
    a_01->magnitude = 1;
    a_01->normalized = 1;
    secp256k1_fe_verify(a_01);
    return;
  }
  return;
}

Assistant:

static void secp256k1_ge_verify(const secp256k1_ge *a) {
#ifdef VERIFY
    secp256k1_fe_verify(&a->x);
    secp256k1_fe_verify(&a->y);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);
#endif
    (void)a;
}